

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::StreamArchive::StreamArchive(StreamArchive *this,string *path_,DatabaseMode mode_)

{
  unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
  *local_28;
  DatabaseMode mode__local;
  string *path__local;
  StreamArchive *this_local;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__StreamArchive_00209c70;
  this->imported_metadata = (ExportedMetadataHeader *)0x0;
  this->file = (FILE *)0x0;
  std::__cxx11::string::string((string *)&this->path,(string *)path_);
  local_28 = this->seen_blobs;
  do {
    std::
    unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
    ::unordered_map(local_28);
    local_28 = local_28 + 1;
  } while (local_28 !=
           (unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
            *)&this->mode);
  this->mode = mode_;
  this->zlib_buffer = (uint8_t *)0x0;
  this->zlib_buffer_size = 0;
  this->alive = false;
  std::mutex::mutex(&this->read_lock);
  return;
}

Assistant:

StreamArchive(const string &path_, DatabaseMode mode_)
		: DatabaseInterface(mode_), path(path_), mode(mode_)
	{
	}